

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall
Board::PopulateBoard
          (Board *this,vector<Cord,_std::allocator<Cord>_> *cords,int fromTop,int fromleft)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  int iVar4;
  int y;
  int x;
  int i;
  int fromleft_local;
  int fromTop_local;
  vector<Cord,_std::allocator<Cord>_> *cords_local;
  Board *this_local;
  
  y = 0;
  while( true ) {
    sVar2 = std::vector<Cord,_std::allocator<Cord>_>::size(cords);
    if (sVar2 <= (ulong)(long)y) break;
    pvVar3 = std::vector<Cord,_std::allocator<Cord>_>::operator[](cords,(long)y);
    iVar1 = pvVar3->x + 10 + fromTop;
    pvVar3 = std::vector<Cord,_std::allocator<Cord>_>::operator[](cords,(long)y);
    iVar4 = pvVar3->y + 10 + fromleft;
    Cell::SetNextState(this->boardWorld[iVar1] + iVar4,FILLED);
    Cell::Increment(this->boardWorld[iVar1] + iVar4);
    y = y + 1;
  }
  return;
}

Assistant:

void Board::PopulateBoard(std::vector<Cord> const & cords, int fromTop, int fromleft)
{
    for(int i = 0; i < cords.size(); i++)
    {
        int x = cords[i].x + MARGIN + fromTop;
        int y = cords[i].y + MARGIN + fromleft;

        boardWorld[x][y].SetNextState(CellState::FILLED);
        boardWorld[x][y].Increment();
    }
}